

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void minMaxFinalize(sqlite3_context *context)

{
  Mem *pMVar1;
  
  pMVar1 = context->pMem;
  if ((pMVar1->flags & 0x2000) == 0) {
    sqlite3VdbeMemReleaseExternal(pMVar1);
    pMVar1->flags = 1;
    pMVar1->z = (char *)0x0;
  }
  pMVar1 = (Mem *)pMVar1->z;
  if (pMVar1 != (Mem *)0x0) {
    if (pMVar1->flags != 0) {
      sqlite3VdbeMemCopy(&context->s,pMVar1);
    }
    sqlite3VdbeMemRelease(pMVar1);
    return;
  }
  return;
}

Assistant:

static void minMaxFinalize(sqlite3_context *context){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    sqlite3VdbeMemRelease(pRes);
  }
}